

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Device.cxx
# Opt level: O2

Fl_Display_Device * Fl_Display_Device::display_device(void)

{
  int iVar1;
  Fl_Surface_Device *pFVar2;
  Fl_Graphics_Driver *this;
  
  if (display_device()::display == '\0') {
    iVar1 = __cxa_guard_acquire(&display_device()::display);
    if (iVar1 != 0) {
      pFVar2 = (Fl_Surface_Device *)operator_new(0x10);
      this = (Fl_Graphics_Driver *)operator_new(0x6d0);
      Fl_Xlib_Graphics_Driver::Fl_Xlib_Graphics_Driver((Fl_Xlib_Graphics_Driver *)this);
      pFVar2->_driver = this;
      (pFVar2->super_Fl_Device)._vptr_Fl_Device = (_func_int **)&PTR_class_name_002771f8;
      fl_graphics_driver = this;
      Fl_Surface_Device::_surface = pFVar2;
      display_device::display = (Fl_Display_Device *)pFVar2;
      __cxa_guard_release(&display_device()::display);
    }
  }
  return display_device::display;
}

Assistant:

Fl_Display_Device *Fl_Display_Device::display_device() {
  static Fl_Display_Device *display = new Fl_Display_Device(new
#if defined(__APPLE__)
                                                                  Fl_Quartz_Graphics_Driver
#elif defined(WIN32)
                                                                  Fl_GDI_Graphics_Driver
#else
                                                                  Fl_Xlib_Graphics_Driver
#endif
                                                                 );
  return display;
}